

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O3

void __thiscall
TlbImport::load(TlbImport *this,istream *stream,config_set *config,Registry *registry)

{
  xmlNodePtr node;
  xmlChar *pxVar1;
  NodeLoader loader_;
  _Link_type p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Base_ptr p_Var5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  iterator iVar10;
  ostream *poVar11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  byte extraout_var;
  runtime_error *this_00;
  MalformedXML *this_01;
  BadRootElement *this_02;
  long *plVar16;
  size_type *psVar17;
  config_set *extraout_RDX;
  long *plVar18;
  ulong uVar19;
  char *pcVar20;
  _Link_type p_Var21;
  _Link_type p_Var22;
  undefined1 auVar23 [8];
  _Base_ptr p_Var24;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  string name;
  TypeMap all_types;
  stringbuf buffer;
  string type_file;
  string document;
  _Alloc_hider local_190;
  _Base_ptr p_Stack_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  _Base_ptr local_168;
  char local_160 [16];
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Base_ptr local_130;
  _Rb_tree_node_base *local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  undefined1 auStack_110 [24];
  _Alloc_hider local_f8;
  _Base_ptr p_Stack_f0;
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [24];
  _Base_ptr local_b0;
  uchar local_a8 [8];
  undefined1 local_a0 [16];
  _Base_ptr local_90;
  _Base_ptr local_88;
  undefined1 local_80 [16];
  _Rb_tree_node_base *local_70 [2];
  _Rb_tree_node_base local_60;
  undefined1 local_40 [16];
  
  local_60._M_left = (_Base_ptr)local_40;
  local_60._M_right = (_Base_ptr)0x0;
  local_40[0] = 0;
  uVar19 = 0;
  p_Var24 = (_Base_ptr)registry;
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    local_c8._16_8_ = registry;
    do {
      local_120 = (undefined1  [8])std::ostream::_M_insert<unsigned_long>;
      local_f8._M_p = (pointer)0x0;
      p_Stack_f0 = (_Base_ptr)0x0;
      auStack_110._8_8_ = (_Link_type)0x0;
      auStack_110._16_8_ = (_Link_type)0x0;
      local_118._M_p = (pointer)0x0;
      auStack_110._0_8_ = (_Link_type)0x0;
      std::locale::locale((locale *)&local_e8);
      local_120 = (undefined1  [8])std::ios_base::Init::~Init;
      local_e8._M_parent._0_4_ = 0x18;
      local_e8._M_left = (_Base_ptr)local_c8;
      local_e8._M_right = (_Base_ptr)0x0;
      local_c8[0] = _S_red;
      std::istream::operator>>((istream *)stream,(streambuf *)local_120);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_60._M_left,local_150._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_);
      }
      local_120 = (undefined1  [8])std::ios_base::Init::~Init;
      if (local_e8._M_left != (_Base_ptr)local_c8) {
        operator_delete(local_e8._M_left);
      }
      local_120 = (undefined1  [8])std::ostream::_M_insert<unsigned_long>;
      std::locale::~locale((locale *)&local_e8);
    } while (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0);
    uVar19 = (ulong)local_60._M_right & 0xffffffff;
    config = extraout_RDX;
    p_Var24 = (_Base_ptr)local_c8._16_8_;
  }
  lVar8 = xmlParseMemory(local_60._M_left,uVar19,config);
  if (lVar8 == 0) {
    this_01 = (MalformedXML *)__cxa_allocate_exception(0x60);
    local_120 = (undefined1  [8])auStack_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
    Parsing::MalformedXML::MalformedXML(this_01,(string *)local_120);
    __cxa_throw(this_01,&Parsing::MalformedXML::typeinfo,Typelib::ImportError::~ImportError);
  }
  local_90 = (_Base_ptr)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  lVar9 = xmlDocGetRootElement(lVar8);
  if (lVar9 != 0) {
    iVar7 = xmlStrcmp(*(undefined8 *)(lVar9 + 0x10),"typelib");
    if (iVar7 != 0) {
      this_02 = (BadRootElement *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string
                ((string *)local_120,*(char **)(lVar9 + 0x10),(allocator *)(local_c8 + 0x18));
      local_150._0_8_ = &local_140;
      local_150._8_8_ = 7;
      local_140._M_allocated_capacity = 0x62696c65707974;
      local_190._M_p = (pointer)&local_180;
      p_Stack_188 = (_Base_ptr)0x0;
      local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
      Parsing::BadRootElement::BadRootElement
                (this_02,(string *)local_120,(string *)local_150,(string *)&local_190);
      __cxa_throw(this_02,&Parsing::BadRootElement::typeinfo,
                  Parsing::BadRootElement::~BadRootElement);
    }
    local_140._8_8_ = local_150 + 8;
    local_150._8_8_ = local_150._8_8_ & 0xffffffff00000000;
    local_140._M_allocated_capacity = 0;
    local_128 = (_Rb_tree_node_base *)0x0;
    local_130 = (_Base_ptr)local_140._8_8_;
    p_Var5 = (_Base_ptr)local_c8._16_8_;
    for (node = *(xmlNodePtr *)(lVar9 + 0x18); local_c8._16_8_ = p_Var24, node != (xmlNodePtr)0x0;
        node = node->next) {
      iVar7 = xmlStrcmp(node->name,"comment");
      if ((iVar7 != 0) && (iVar7 = xmlStrcmp(node->name,"text"), iVar7 != 0)) {
        (anonymous_namespace)::getStringAttribute_abi_cxx11_
                  ((string *)&local_170,(_anonymous_namespace_ *)node,(xmlNodePtr)"name",
                   (char *)registry);
        pxVar1 = node->name;
        plVar18 = (long *)((anonymous_namespace)::node_categories + 0x10);
        pcVar20 = "alias";
        while (iVar7 = xmlStrcmp(pxVar1,pcVar20), iVar7 != 0) {
          pcVar20 = (char *)*plVar18;
          plVar18 = plVar18 + 2;
          if (pcVar20 == (char *)0x0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_b0 = (_Base_ptr)local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_c8 + 0x18),"unrecognized XML node \'","");
            plVar18 = (long *)std::__cxx11::string::append(local_c8 + 0x18);
            local_190._M_p = (pointer)*plVar18;
            plVar16 = plVar18 + 2;
            if ((long *)local_190._M_p == plVar16) {
              local_180._M_allocated_capacity = *plVar16;
              local_180._8_8_ = plVar18[3];
              local_190._M_p = (pointer)&local_180;
            }
            else {
              local_180._M_allocated_capacity = *plVar16;
            }
            p_Stack_188 = (_Base_ptr)plVar18[1];
            *plVar18 = (long)plVar16;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_120 = (undefined1  [8])*plVar18;
            psVar17 = (size_type *)(plVar18 + 2);
            if (local_120 == (undefined1  [8])psVar17) {
              auStack_110._0_8_ = *psVar17;
              auStack_110._8_8_ = plVar18[3];
              local_120 = (undefined1  [8])auStack_110;
            }
            else {
              auStack_110._0_8_ = *psVar17;
            }
            local_118._M_p = (pointer)plVar18[1];
            *plVar18 = (long)psVar17;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            std::runtime_error::runtime_error(this_00,(string *)local_120);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        loader_ = (NodeLoader)plVar18[-1];
        iVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                         *)local_150,(key_type *)&local_170);
        p_Var15 = (_Base_ptr)(local_150 + 8);
        if (iVar10._M_node == p_Var15) {
          local_70[0] = (_Rb_tree_node_base *)((long)local_70 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_90,
                     (char *)((long)&local_88->_M_color + (long)&local_90->_M_color));
          (anonymous_namespace)::getStringAttribute_abi_cxx11_
                    ((string *)local_120,(_anonymous_namespace_ *)node,(xmlNodePtr)"source_id",
                     (char *)p_Var15);
          std::__cxx11::string::operator=((string *)local_70,(string *)local_120);
          if (local_120 != (undefined1  [8])auStack_110) {
            operator_delete((void *)local_120);
          }
          registry = (Registry *)local_70;
          anon_unknown.dwarf_18458::TypeNode::TypeNode
                    ((TypeNode *)local_120,node,(string *)&local_170,(string *)registry,loader_);
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                   ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                     *)local_140._M_allocated_capacity,(_Link_type)(local_150 + 8),
                                    (_Base_ptr)&local_170,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)registry);
          if (((_Link_type)iVar12._M_node == (_Link_type)(local_150 + 8)) ||
             (iVar7 = std::__cxx11::string::compare((string *)&local_170), iVar7 < 0)) {
            p_Var13 = (_Rb_tree_node_base *)operator_new(0x90);
            p_Var22 = (_Link_type)(p_Var13 + 1);
            *(_Base_ptr **)(p_Var13 + 1) = &p_Var13[1]._M_left;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)p_Var22,local_170._M_p,local_170._M_p + (long)&local_168->_M_color)
            ;
            local_190._M_p = (pointer)&local_180;
            p_Stack_188 = (_Base_ptr)0x0;
            local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
            local_a8[0] = '\0';
            local_a8[1] = '\0';
            local_a8[2] = '\0';
            local_a8[3] = '\0';
            local_a8[4] = '\0';
            local_a8[5] = '\0';
            local_a8[6] = '\0';
            local_a8[7] = '\0';
            local_a0[0] = _S_red;
            registry = (Registry *)(local_c8 + 0x18);
            local_b0 = (_Base_ptr)local_a0;
            anon_unknown.dwarf_18458::TypeNode::TypeNode
                      ((TypeNode *)(p_Var13 + 2),(xmlNodePtr)0x0,(string *)&local_190,
                       (string *)registry,(NodeLoader)0x0);
            if (local_b0 != (_Base_ptr)local_a0) {
              operator_delete(local_b0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != &local_180) {
              operator_delete(local_190._M_p);
            }
            if (iVar12._M_node == (_Base_ptr)(local_150 + 8)) {
              if ((local_128 == (_Rb_tree_node_base *)0x0) ||
                 (p_Var21 = p_Var22,
                 iVar7 = std::__cxx11::string::compare((string *)(local_130 + 1)), -1 < iVar7)) {
LAB_0010af54:
                p_Var21 = p_Var22;
                pVar25 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                         ::_M_get_insert_unique_pos
                                   ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                     *)local_150,(key_type *)p_Var22);
              }
              else {
LAB_0010af23:
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_130;
                pVar25 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                         (auVar4 << 0x40);
              }
LAB_0010af64:
              iVar12._M_node = pVar25.first;
              if (pVar25.second == (_Rb_tree_node_base *)0x0) {
LAB_0010af9d:
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                ::_M_destroy_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                   *)p_Var13,p_Var21);
                operator_delete(p_Var13);
                goto LAB_0010afea;
              }
            }
            else {
              p_Var21 = (_Link_type)(iVar12._M_node + 1);
              iVar7 = std::__cxx11::string::compare((string *)p_Var22);
              if (-1 < iVar7) {
                p_Var21 = p_Var22;
                iVar7 = std::__cxx11::string::compare((string *)(iVar12._M_node + 1));
                if (iVar7 < 0) {
                  if (local_130 == iVar12._M_node) goto LAB_0010af23;
                  p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar12._M_node);
                  pVar25.second = p_Var14;
                  pVar25.first = p_Var14;
                  p_Var21 = (_Link_type)(p_Var14 + 1);
                  iVar7 = std::__cxx11::string::compare((string *)p_Var22);
                  if (-1 < iVar7) goto LAB_0010af54;
                  if ((iVar12._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_0010b0a2;
                  goto LAB_0010af64;
                }
                goto LAB_0010af9d;
              }
              pVar25.second = (_Rb_tree_node_base *)local_140._8_8_;
              pVar25.first = (_Rb_tree_node_base *)local_140._8_8_;
              if ((_Base_ptr)local_140._8_8_ == iVar12._M_node) goto LAB_0010af64;
              p_Var15 = (_Base_ptr)std::_Rb_tree_decrement(iVar12._M_node);
              p_Var21 = p_Var22;
              iVar7 = std::__cxx11::string::compare((string *)(p_Var15 + 1));
              if (-1 < iVar7) goto LAB_0010af54;
              pVar25.second = iVar12._M_node;
              pVar25.first = iVar12._M_node;
              iVar12._M_node = p_Var15;
              if (p_Var15->_M_right != (_Base_ptr)0x0) goto LAB_0010af64;
LAB_0010b0a2:
              auVar3._8_8_ = 0;
              auVar3._0_8_ = iVar12._M_node;
              pVar25 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar3 << 0x40);
            }
            bVar6 = true;
            if (((_Rb_tree_node_base *)(local_150 + 8) != pVar25.second) &&
               (pVar25.first == (_Rb_tree_node_base *)0x0)) {
              std::__cxx11::string::compare((string *)p_Var22);
              bVar6 = (bool)(extraout_var >> 7);
            }
            registry = (Registry *)(local_150 + 8);
            std::_Rb_tree_insert_and_rebalance
                      (bVar6,p_Var13,pVar25.second,(_Rb_tree_node_base *)registry);
            local_128 = (_Rb_tree_node_base *)((long)&local_128->_M_color + 1);
            iVar12._M_node = p_Var13;
          }
LAB_0010afea:
          *(undefined1 (*) [8])(iVar12._M_node + 2) = local_120;
          std::__cxx11::string::operator=
                    ((string *)&iVar12._M_node[2]._M_parent,(string *)&local_118);
          std::__cxx11::string::operator=
                    ((string *)&iVar12._M_node[3]._M_parent,(string *)&local_f8);
          iVar12._M_node[4]._M_parent = local_e8._M_left;
          if ((_Rb_tree_node_base *)local_f8._M_p != &local_e8) {
            operator_delete(local_f8._M_p);
          }
          if (local_118._M_p != auStack_110 + 8) {
            operator_delete(local_118._M_p);
          }
          p_Var13 = (_Rb_tree_node_base *)((long)local_70 + 0x10);
          auVar23 = (undefined1  [8])local_70[0];
        }
        else {
          registry = (Registry *)auStack_110;
          local_120 = (undefined1  [8])registry;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,iVar10._M_node[3]._M_parent,
                     (long)&(iVar10._M_node[3]._M_parent)->_M_color +
                     (long)&(iVar10._M_node[3]._M_left)->_M_color);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Type ",5);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::clog,local_170._M_p,(long)local_168);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," has already been defined in ",0x1d);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_120,(long)local_118._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,"\tThe definition found in ",0x19);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::clog,(char *)local_90,(long)local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," will be ignored",0x10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          p_Var13 = (_Rb_tree_node_base *)auStack_110;
          auVar23 = local_120;
        }
        if (auVar23 != (undefined1  [8])p_Var13) {
          operator_delete((void *)auVar23);
        }
        if (local_170._M_p != local_160) {
          operator_delete(local_170._M_p);
        }
      }
      p_Var24 = (_Base_ptr)local_c8._16_8_;
      p_Var5 = (_Base_ptr)local_c8._16_8_;
    }
    p_Var22 = (_Link_type)&local_118;
    local_118._M_p = local_118._M_p & 0xffffffff00000000;
    local_190._M_p = (pointer)0x0;
    p_Stack_188 = (_Base_ptr)0x0;
    local_180._M_allocated_capacity = (size_type)local_120;
    auStack_110._0_8_ = (_Link_type)0x0;
    local_f8._M_p = (pointer)0x0;
    auStack_110._8_8_ = p_Var22;
    auStack_110._16_8_ = p_Var22;
    p_Stack_f0 = (_Base_ptr)local_c8._16_8_;
    if ((_Base_ptr)local_140._M_allocated_capacity != (_Base_ptr)0x0) {
      local_c8._16_8_ = p_Var5;
      auStack_110._0_8_ =
           std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
           ::
           _M_copy<false,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>::_Reuse_or_alloc_node>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
                       *)local_140._M_allocated_capacity,p_Var22,(_Base_ptr)&local_190,
                      (_Reuse_or_alloc_node *)local_180._M_allocated_capacity);
      p_Var21 = (_Link_type)auStack_110._0_8_;
      do {
        auStack_110._8_8_ = p_Var21;
        p_Var21 = (_Link_type)(((_Link_type)auStack_110._8_8_)->super__Rb_tree_node_base)._M_left;
        p_Var2 = (_Link_type)auStack_110._0_8_;
      } while (p_Var21 != (_Link_type)0x0);
      do {
        auStack_110._16_8_ = p_Var2;
        p_Var2 = (_Link_type)(((_Link_type)auStack_110._16_8_)->super__Rb_tree_node_base)._M_right;
      } while (p_Var2 != (_Link_type)0x0);
      local_f8._M_p = (pointer)local_128;
      p_Var5 = (_Base_ptr)local_c8._16_8_;
    }
    local_c8._16_8_ = p_Var5;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)local_190._M_p,p_Var22);
    if ((_Rb_tree_node_base *)local_f8._M_p != (_Rb_tree_node_base *)0x0) {
      do {
        lVar9 = *(long *)((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>
                           *)(auStack_110._8_8_ + 0x20))->_M_storage;
        local_190._M_p = (pointer)&local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,lVar9,*(long *)(auStack_110._8_8_ + 0x28) + lVar9);
        p_Var22 = (_Link_type)&local_190;
        anon_unknown.dwarf_18458::Factory::build((Factory *)local_120,(string *)&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p);
        }
      } while ((_Rb_tree_node_base *)local_f8._M_p != (_Rb_tree_node_base *)0x0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)auStack_110._0_8_,p_Var22);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)local_140._M_allocated_capacity,p_Var22);
  }
  if (local_90 != (_Base_ptr)local_80) {
    operator_delete(local_90);
  }
  xmlFreeDoc(lVar8);
  if (local_60._M_left != (_Base_ptr)local_40) {
    operator_delete(local_60._M_left);
  }
  return;
}

Assistant:

void TlbImport::load
    ( std::istream& stream
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // libXML is not really iostream-compatible :(
    // Get the whole document
    std::string document;

    while (stream.good())
    {
        std::stringbuf buffer;
        stream >> &buffer;
        document += buffer.str();
    }
    xmlDocPtr doc = xmlParseMemory(document.c_str(), document.length());
    if (!doc)
        throw Parsing::MalformedXML();

    try
    {
        // giving "" as source_id is rather counterproductive... later
        // errormessages are not informative anymore...
        parse("", doc, registry);
        xmlFreeDoc(doc);
    }
    catch(...)
    {
        xmlFreeDoc(doc);
        throw;
    }
}